

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

uint cppwinrt::get_attribute_value<unsigned_int>(CustomAttribute *attribute,uint32_t arg)

{
  uint uVar1;
  CustomAttributeSig local_40;
  
  winmd::reader::CustomAttribute::Value(&local_40,attribute);
  uVar1 = get_attribute_value<unsigned_int>
                    (local_40.m_fixed_args.
                     super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                     ._M_impl.super__Vector_impl_data._M_start + arg);
  winmd::reader::CustomAttributeSig::~CustomAttributeSig(&local_40);
  return uVar1;
}

Assistant:

auto get_attribute_value(CustomAttribute const& attribute, uint32_t const arg)
    {
        return get_attribute_value<T>(attribute.Value().FixedArgs()[arg]);
    }